

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSolve.c
# Opt level: O2

void Cec_ManSatSolveSeq_rec
               (Cec_ManSat_t *pSat,Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Ptr_t *vInfo,int iPat,int nRegs)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  void *pvVar4;
  
  while( true ) {
    iVar1 = Gia_ObjIsTravIdCurrent(p,pObj);
    if (iVar1 != 0) {
      return;
    }
    Gia_ObjSetTravIdCurrent(p,pObj);
    uVar2 = (uint)*(undefined8 *)pObj;
    if ((~uVar2 & 0x9fffffff) == 0) break;
    if (((int)uVar2 < 0) || ((uVar2 & 0x1fffffff) == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSolve.c"
                    ,0x37b,
                    "void Cec_ManSatSolveSeq_rec(Cec_ManSat_t *, Gia_Man_t *, Gia_Obj_t *, Vec_Ptr_t *, int, int)"
                   );
    }
    Cec_ManSatSolveSeq_rec(pSat,p,pObj + -(ulong)(uVar2 & 0x1fffffff),vInfo,iPat,nRegs);
    pObj = pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff);
  }
  iVar1 = Gia_ObjCioId(pObj);
  pvVar4 = Vec_PtrEntry(vInfo,nRegs + iVar1);
  uVar3 = Cec_ObjSatVarValue(pSat,pObj);
  uVar2 = *(uint *)((long)pvVar4 + (long)(iPat >> 5) * 4);
  if (uVar3 != ((uVar2 >> (iPat & 0x1fU) & 1) != 0)) {
    *(uint *)((long)pvVar4 + (long)(iPat >> 5) * 4) = uVar2 ^ 1 << (iPat & 0x1fU);
  }
  pSat->nCexLits = pSat->nCexLits + 1;
  return;
}

Assistant:

void Cec_ManSatSolveSeq_rec( Cec_ManSat_t * pSat, Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Ptr_t * vInfo, int iPat, int nRegs )
{
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return;
    Gia_ObjSetTravIdCurrent(p, pObj);
    if ( Gia_ObjIsCi(pObj) )
    {
        unsigned * pInfo = (unsigned *)Vec_PtrEntry( vInfo, nRegs + Gia_ObjCioId(pObj) );
        if ( Cec_ObjSatVarValue( pSat, pObj ) != Abc_InfoHasBit( pInfo, iPat ) )
            Abc_InfoXorBit( pInfo, iPat );
        pSat->nCexLits++;
//        Vec_IntPush( pSat->vCex, Abc_Var2Lit( Gia_ObjCioId(pObj), !Cec_ObjSatVarValue(pSat, pObj) ) );
        return;
    }
    assert( Gia_ObjIsAnd(pObj) );
    Cec_ManSatSolveSeq_rec( pSat, p, Gia_ObjFanin0(pObj), vInfo, iPat, nRegs );
    Cec_ManSatSolveSeq_rec( pSat, p, Gia_ObjFanin1(pObj), vInfo, iPat, nRegs );
}